

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_arrayremove(HSQUIRRELVM v,SQInteger idx,SQInteger itemidx)

{
  bool bVar1;
  SQRESULT SVar2;
  SQObjectPtr *arr;
  
  if (v->_stackbase < v->_top) {
    bVar1 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&arr);
    SVar2 = -1;
    if (bVar1) {
      bVar1 = SQArray::Remove((arr->super_SQObject)._unVal.pArray,itemidx);
      if (bVar1) {
        SVar2 = 0;
      }
      else {
        sq_throwerror(v,"index out of range");
      }
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar2 = -1;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_arrayremove(HSQUIRRELVM v,SQInteger idx,SQInteger itemidx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    return _array(*arr)->Remove(itemidx) ? SQ_OK : sq_throwerror(v,_SC("index out of range"));
}